

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

errr finish_parse_trap(parser *p)

{
  ushort uVar1;
  void *pvVar2;
  ulong uVar3;
  trap_kind_conflict *ptVar4;
  void *pvVar5;
  undefined8 *puVar6;
  uint16_t uVar7;
  long lVar8;
  ulong uVar9;
  undefined8 *puVar10;
  trap_kind_conflict *ptVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  
  bVar14 = 0;
  z_info->trap_max = 0;
  pvVar5 = parser_priv(p);
  uVar7 = z_info->trap_max;
  if (pvVar5 != (void *)0x0) {
    do {
      uVar7 = uVar7 + 1;
      pvVar5 = *(void **)((long)pvVar5 + 0x38);
    } while (pvVar5 != (void *)0x0);
    z_info->trap_max = uVar7;
  }
  trap_info = (trap_kind_conflict *)mem_zalloc((ulong)uVar7 * 0x80 + 0x80);
  uVar1 = z_info->trap_max;
  puVar6 = (undefined8 *)parser_priv(p);
  if (puVar6 != (undefined8 *)0x0) {
    lVar13 = (ulong)uVar1 << 7;
    uVar3 = (ulong)uVar1;
    do {
      uVar9 = uVar3 - 1;
      if (lVar13 == 0) {
        __assert_fail("tidx >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0x79f,"errr finish_parse_trap(struct parser *)");
      }
      uVar12 = uVar9 & 0xffffffff;
      puVar10 = puVar6;
      ptVar11 = trap_info + uVar12;
      for (lVar8 = 0x10; ptVar4 = trap_info, lVar8 != 0; lVar8 = lVar8 + -1) {
        ptVar11->name = (char *)*puVar10;
        puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
        ptVar11 = (trap_kind_conflict *)((long)ptVar11 + (ulong)bVar14 * -0x10 + 8);
      }
      trap_info[uVar12].tidx = (int)uVar9;
      ptVar11 = (trap_kind_conflict *)(ptVar4->flags + lVar13 + -0x68);
      if (z_info->trap_max <= uVar3) {
        ptVar11 = (trap_kind_conflict *)0x0;
      }
      ptVar4[uVar12].next = ptVar11;
      puVar6 = (undefined8 *)puVar6[7];
      lVar13 = lVar13 + -0x80;
      uVar3 = uVar9;
    } while (puVar6 != (undefined8 *)0x0);
  }
  pvVar5 = parser_priv(p);
  while (pvVar5 != (void *)0x0) {
    pvVar2 = *(void **)((long)pvVar5 + 0x38);
    mem_free(pvVar5);
    pvVar5 = pvVar2;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_trap(struct parser *p) {
	struct trap_kind *t, *n;
	int tidx;

	/* Scan the list for the max id */
	z_info->trap_max = 0;
	t = parser_priv(p);
	while (t) {
		z_info->trap_max++;
		t = t->next;
	}

	trap_info = mem_zalloc((z_info->trap_max + 1) * sizeof(*t));
	tidx = z_info->trap_max - 1;
    for (t = parser_priv(p); t; t = t->next, tidx--) {
		assert(tidx >= 0);

		memcpy(&trap_info[tidx], t, sizeof(*t));
		trap_info[tidx].tidx = tidx;
		if (tidx < z_info->trap_max - 1)
			trap_info[tidx].next = &trap_info[tidx + 1];
		else
			trap_info[tidx].next = NULL;
    }

    t = parser_priv(p);
    while (t) {
		n = t->next;
		mem_free(t);
		t = n;
    }

    parser_destroy(p);
    return 0;
}